

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

bool __thiscall
helics::CommonCore::enterInitializingMode
          (CommonCore *this,LocalFederateId federateID,IterationRequest request)

{
  FederateStates FVar1;
  bool bVar2;
  IterationResult IVar3;
  int iVar4;
  FederateState *this_00;
  InvalidFunctionCall *this_01;
  HelicsException *this_02;
  char *pcVar5;
  IterationRequest iterate;
  pointer_____offset_0x10___ *ppuVar6;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view message_02;
  string_view message_03;
  string_view message_04;
  string_view message_05;
  string_view message_06;
  string_view message_07;
  string_view errorString;
  size_t sStack_f0;
  bool exp;
  ActionMessage init;
  
  this_00 = getFederateAt(this,federateID);
  if (this_00 == (FederateState *)0x0) {
    this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
    message._M_str = "federateID not valid for Entering Init";
    message._M_len = 0x26;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_01,message);
    ppuVar6 = &InvalidIdentifier::typeinfo;
  }
  else {
    iVar4 = (int)(char)request;
    if (iVar4 - 1U < 2) {
      iterate = NO_ITERATIONS;
      if (this_00->mCallbackBased == false) {
        iterate = request;
      }
    }
    else {
      if (iVar4 == 7) {
        errorString._M_str = "error condition called in enterInitializingMode";
        errorString._M_len = 0x2f;
        localError(this,federateID,0x22,errorString);
        return false;
      }
      iterate = request;
      if (iVar4 == 3) {
        finalize(this,federateID);
        return false;
      }
    }
    FVar1 = FederateState::getState(this_00);
    if (FVar1 == CREATED) {
      exp = false;
      bVar2 = std::atomic<bool>::compare_exchange_strong
                        ((atomic<bool> *)&this_00->initRequested,&exp,true,seq_cst);
      if (bVar2) {
        ActionMessage::ActionMessage(&init,cmd_init);
        init.source_id.gid = (this_00->global_id)._M_i.gid;
        if (iterate != NO_ITERATIONS) {
          setIterationFlags(&init,iterate);
          LOCK();
          (this_00->initIterating)._M_base._M_i = true;
          UNLOCK();
          LOCK();
          (this->initIterations)._M_base._M_i = true;
          UNLOCK();
        }
        BrokerBase::addActionMessage(&this->super_BrokerBase,&init);
        bVar2 = this_00->mCallbackBased;
        if (bVar2 == false) {
          IVar3 = FederateState::enterInitializingMode(this_00,iterate);
          LOCK();
          (this_00->initRequested)._M_base._M_i = false;
          UNLOCK();
          if ((IVar3 != NEXT_STEP) && (IVar3 != ITERATING)) {
            if (IVar3 == HALTED) {
              this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
              message_02._M_str = "HELICS system failure";
              message_02._M_len = 0x15;
              HelicsSystemFailure::HelicsSystemFailure((HelicsSystemFailure *)this_02,message_02);
              ppuVar6 = &HelicsSystemFailure::typeinfo;
            }
            else {
              switch(this_00->errorCode) {
              case 0:
                goto switchD_0024633f_caseD_0;
              case -10:
              case -9:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_01._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_01._M_len = (this_00->errorString)._M_string_length;
                InvalidFunctionCall::InvalidFunctionCall((InvalidFunctionCall *)this_02,message_01);
                ppuVar6 = &InvalidFunctionCall::typeinfo;
                break;
              default:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_06._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_06._M_len = (this_00->errorString)._M_string_length;
                HelicsException::HelicsException(this_02,message_06);
                ppuVar6 = &HelicsException::typeinfo;
                break;
              case -4:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_07._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_07._M_len = (this_00->errorString)._M_string_length;
                InvalidParameter::InvalidParameter((InvalidParameter *)this_02,message_07);
                ppuVar6 = &InvalidParameter::typeinfo;
                break;
              case -3:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_05._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_05._M_len = (this_00->errorString)._M_string_length;
                InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_02,message_05);
                ppuVar6 = &InvalidIdentifier::typeinfo;
                break;
              case -2:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_04._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_04._M_len = (this_00->errorString)._M_string_length;
                ConnectionFailure::ConnectionFailure((ConnectionFailure *)this_02,message_04);
                ppuVar6 = &ConnectionFailure::typeinfo;
                break;
              case -1:
                this_02 = (HelicsException *)__cxa_allocate_exception(0x28);
                message_03._M_str = (this_00->errorString)._M_dataplus._M_p;
                message_03._M_len = (this_00->errorString)._M_string_length;
                RegistrationFailure::RegistrationFailure((RegistrationFailure *)this_02,message_03);
                ppuVar6 = &RegistrationFailure::typeinfo;
              }
            }
            __cxa_throw(this_02,ppuVar6,HelicsException::~HelicsException);
          }
        }
switchD_0024633f_caseD_0:
        ActionMessage::~ActionMessage(&init);
        return (bool)(bVar2 ^ 1);
      }
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar5 = "federate already has requested entry to initializing State";
      sStack_f0 = 0x3a;
    }
    else {
      if ((FVar1 == INITIALIZING) && (iterate == NO_ITERATIONS)) {
        return false;
      }
      this_01 = (InvalidFunctionCall *)__cxa_allocate_exception(0x28);
      pcVar5 = "May only enter initializing state from created state";
      sStack_f0 = 0x34;
    }
    message_00._M_str = pcVar5;
    message_00._M_len = sStack_f0;
    InvalidFunctionCall::InvalidFunctionCall(this_01,message_00);
    ppuVar6 = &InvalidFunctionCall::typeinfo;
  }
  __cxa_throw(this_01,ppuVar6,HelicsException::~HelicsException);
}

Assistant:

bool CommonCore::enterInitializingMode(LocalFederateId federateID, IterationRequest request)
{
    auto* fed = getFederateAt(federateID);
    if (fed == nullptr) {
        throw(InvalidIdentifier("federateID not valid for Entering Init"));
    }
    switch (request) {
        case IterationRequest::HALT_OPERATIONS:
            return finalize(federateID), false;
        case IterationRequest::ERROR_CONDITION:
            return localError(federateID, 34, "error condition called in enterInitializingMode"),
                   false;
        case IterationRequest::FORCE_ITERATION:
        case IterationRequest::ITERATE_IF_NEEDED:
            if (fed->isCallbackFederate()) {
                // callback federates cannot iterate in startup
                request = IterationRequest::NO_ITERATIONS;
            }
            break;
        default:
            break;
    }
    switch (fed->getState()) {
        case FederateStates::CREATED:
            break;
        case FederateStates::INITIALIZING:
            if (request == IterationRequest::NO_ITERATIONS) {
                return false;
            }
            [[fallthrough]];
        default:
            throw(InvalidFunctionCall("May only enter initializing state from created state"));
    }

    bool exp = false;
    // only enter this loop once per federate
    if (fed->initRequested.compare_exchange_strong(exp, true)) {
        ActionMessage init(CMD_INIT);
        init.source_id = fed->global_id.load();
        if (request != IterationRequest::NO_ITERATIONS) {
            setIterationFlags(init, request);
            fed->initIterating.store(true);
            initIterations.store(true);
        }

        addActionMessage(init);

        if (fed->isCallbackFederate()) {
            return false;
        }
        auto check = fed->enterInitializingMode(request);
        fed->initRequested = false;
        switch (check) {
            case IterationResult::NEXT_STEP:
            case IterationResult::ITERATING:
                break;
            case IterationResult::HALTED:
                throw(HelicsSystemFailure());
            default:
                generateFederateException(fed);
                break;
        }

        return true;
    }
    throw(InvalidFunctionCall("federate already has requested entry to initializing State"));
}